

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void wait_for_link(ixgbe_device *dev)

{
  FILE *__stream;
  uint32_t uVar1;
  ixy_device *in_RDI;
  uint32_t poll_interval;
  int32_t max_wait;
  int local_c;
  
  fprintf(_stdout,"[INFO ] %s:%d %s(): Waiting for link...\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
          0x1b3,"wait_for_link");
  for (local_c = 10000000; uVar1 = ixgbe_get_link_speed(in_RDI), __stream = _stdout,
      uVar1 == 0 && 0 < local_c; local_c = local_c + -100000) {
    usleep(100000);
  }
  uVar1 = ixgbe_get_link_speed(in_RDI);
  fprintf(__stream,"[INFO ] %s:%d %s(): Link speed is %d Mbit/s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
          0x1ba,"wait_for_link",(ulong)uVar1);
  return;
}

Assistant:

static void wait_for_link(const struct ixgbe_device* dev) {
	info("Waiting for link...");
	int32_t max_wait = 10000000; // 10 seconds in us
	uint32_t poll_interval = 100000; // 10 ms in us
	while (!(ixgbe_get_link_speed(&dev->ixy)) && max_wait > 0) {
		usleep(poll_interval);
		max_wait -= poll_interval;
	}
	info("Link speed is %d Mbit/s", ixgbe_get_link_speed(&dev->ixy));
}